

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeStamp.cpp
# Opt level: O2

string * __thiscall
higan::TimeStamp::FormatToString_abi_cxx11_(string *__return_storage_ptr__,TimeStamp *this)

{
  char local_48 [8];
  char buffer [32];
  allocator<char> local_19;
  
  FormatToBuffer(this,local_48,0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_48,&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string TimeStamp::FormatToString() const
{
	char buffer[32];
	FormatToBuffer(buffer, sizeof buffer);
	return buffer;
}